

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  cmMakefile *pcVar1;
  cmLocalGenerator *this_01;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pbVar5;
  char *pcVar6;
  ostream *poVar7;
  ulong uVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  pointer ppcVar9;
  ulong uVar10;
  cmGlobalUnixMakefileGenerator3 *this_02;
  pointer pbVar11;
  string tmpStr;
  string check;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string cache;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  undefined1 local_358 [32];
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string local_300;
  string local_2e0;
  cmLocalGenerator *local_2c0;
  string local_2b8;
  _Base_ptr *local_298 [2];
  _Base_ptr local_288 [2];
  cmGeneratedFileStream local_278;
  
  pcVar6 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)local_298,pcVar6,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_298);
  std::__cxx11::string::append((char *)local_298);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_298[0],false);
  if (((&local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar6 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    std::__cxx11::string::string((string *)&local_2b8,pcVar6,(allocator *)&local_300);
    std::__cxx11::string::append((char *)&local_2b8);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)
               *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start,(ostream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# The generator used is:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_DEPENDS_GENERATOR \"",0x1d);
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
              (&local_300);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_300._M_dataplus._M_p,local_300._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_318.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar9) {
      uVar8 = 0;
      uVar10 = 1;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
                   local_318.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (ppcVar9[uVar8]->Makefile->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (ppcVar9[uVar8]->Makefile->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        pbVar5 = local_318.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar11 = local_318.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar10 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator
                                       .LocalGenerators.
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar9 >>
                                3);
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar2);
      if (local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar8 = (long)local_318.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_318.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (local_318.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_318.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                  (pbVar11,pbVar5);
      }
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_318.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_318.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_318,(iterator)__first._M_current,
               (iterator)
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_2c0 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
    pcVar6 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    std::__cxx11::string::string((string *)&local_300,pcVar6,(allocator *)&local_338);
    std::__cxx11::string::append((char *)&local_300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# The top level Makefile was generated from the following files:\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_DEPENDS\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
    this_00 = &local_2c0->super_cmOutputConverter;
    cmOutputConverter::Convert(&local_338,this_00,&local_300,START_OUTPUT,UNCHANGED);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_338._M_dataplus._M_p,local_338._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if (local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar11 = local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert(&local_338,this_00,pbVar11,START_OUTPUT,UNCHANGED);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_338._M_dataplus._M_p,
                            local_338._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    pcVar6 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    std::__cxx11::string::string((string *)&local_338,pcVar6,(allocator *)local_358);
    std::__cxx11::string::append((char *)&local_338);
    std::__cxx11::string::append((char *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# The corresponding makefile is:\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_OUTPUTS\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
    cmOutputConverter::Convert((string *)local_358,this_00,&local_2b8,START_OUTPUT,UNCHANGED);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,(char *)local_358._0_8_,local_358._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  \"",3);
    cmOutputConverter::Convert(&local_2e0,this_00,&local_338,START_OUTPUT,UNCHANGED);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((cmGlobalUnixMakefileGenerator3 *)local_358._0_8_ !=
        (cmGlobalUnixMakefileGenerator3 *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,CONCAT71(local_358._17_7_,local_358[0x10]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# Byproducts of CMake generate step:\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_PRODUCTS\n",0x1c);
    pcVar1 = local_2c0->Makefile;
    pbVar11 = (pcVar1->OutputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar11 !=
        (pcVar1->OutputFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert((string *)local_358,this_00,pbVar11,HOME_OUTPUT,UNCHANGED);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,(char *)local_358._0_8_,local_358._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        if ((cmGlobalUnixMakefileGenerator3 *)local_358._0_8_ !=
            (cmGlobalUnixMakefileGenerator3 *)(local_358 + 0x10)) {
          operator_delete((void *)local_358._0_8_,CONCAT71(local_358._17_7_,local_358[0x10]) + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               (pcVar1->OutputFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_358._0_8_ = local_358 + 0x10;
    local_358._8_8_ = (char *)0x0;
    local_358[0x10] = '\0';
    ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar9) {
      uVar8 = 0;
      uVar10 = 1;
      do {
        this_01 = ppcVar9[uVar8];
        pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(this_01);
        uVar4 = local_358._8_8_;
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)local_358,0,(char *)uVar4,(ulong)pcVar6);
        std::__cxx11::string::append((char *)local_358);
        std::__cxx11::string::append((char *)local_358);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::Convert
                  (&local_2e0,&this_01->super_cmOutputConverter,(string *)local_358,HOME_OUTPUT,
                   UNCHANGED);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_2e0._M_dataplus._M_p,
                            local_2e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar10 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator
                                       .LocalGenerators.
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar9 >>
                                3);
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    this_02 = (cmGlobalUnixMakefileGenerator3 *)local_358._0_8_;
    if ((cmGlobalUnixMakefileGenerator3 *)local_358._0_8_ !=
        (cmGlobalUnixMakefileGenerator3 *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,CONCAT71(local_358._17_7_,local_358[0x10]) + 1);
    }
    WriteMainCMakefileLanguageRules
              (this_02,&local_278,
               &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],(ulong)((long)&local_288[0]->_M_color + 1));
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += cmake::GetCMakeFilesDirectory();
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName.c_str());
  if(!cmakefileStream)
    {
    return;
    }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3 *lg =
    static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream
    << "# The generator used is:\n"
    << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName() << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);

    // Get the list of files contributing to this generation step.
    lfiles.insert(lfiles.end(),lg->GetMakefile()->GetListFiles().begin(),
                  lg->GetMakefile()->GetListFiles().end());
    }
  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(),lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[0]);

  // Build the path to the cache file.
  std::string cache = this->GetCMakeInstance()->GetHomeOutputDirectory();
  cache += "/CMakeCache.txt";

  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \""
    << lg->Convert(cache,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  for(std::vector<std::string>::const_iterator i = lfiles.begin();
      i !=  lfiles.end(); ++i)
    {
    cmakefileStream
      << "  \""
      << lg->Convert(*i, cmLocalGenerator::START_OUTPUT)
      << "\"\n";
    }
  cmakefileStream
    << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += cmake::GetCMakeFilesDirectory();
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream
    << "# The corresponding makefile is:\n"
    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
    << "  \""
    << lg->Convert(makefileName,
                   cmLocalGenerator::START_OUTPUT) << "\"\n"
    << "  \""
    << lg->Convert(check,
                   cmLocalGenerator::START_OUTPUT) << "\"\n";
  cmakefileStream << "  )\n\n";

  // CMake must rerun if a byproduct is missing.
  {
  cmakefileStream
    << "# Byproducts of CMake generate step:\n"
    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
  const std::vector<std::string>& outfiles =
    lg->GetMakefile()->GetOutputFiles();
  for(std::vector<std::string>::const_iterator k = outfiles.begin();
      k != outfiles.end(); ++k)
    {
    cmakefileStream << "  \"" <<
      lg->Convert(*k,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }

  // add in all the directory information files
  std::string tmpStr;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    lg =
      static_cast<cmLocalUnixMakefileGenerator3 *>(this->LocalGenerators[i]);
    tmpStr = lg->GetCurrentBinaryDirectory();
    tmpStr += cmake::GetCMakeFilesDirectory();
    tmpStr += "/CMakeDirectoryInformation.cmake";
    cmakefileStream << "  \"" <<
      lg->Convert(tmpStr,cmLocalGenerator::HOME_OUTPUT)
                    << "\"\n";
    }
  cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}